

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O2

void __thiscall IR::AutoReuseOpnd::~AutoReuseOpnd(AutoReuseOpnd *this)

{
  if (this->wasInUse == false) {
    Opnd::UnUse(this->opnd);
    if (this->autoDelete == true) {
      Opnd::Free(this->opnd,this->func);
    }
  }
  return;
}

Assistant:

~AutoReuseOpnd()
    {
        if(wasInUse)
        {
            return;
        }

        opnd->UnUse();
        if(autoDelete)
        {
            opnd->Free(func);
        }
    }